

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O1

void __thiscall
spvtools::opt::UpgradeMemoryModel::UpgradeExtInst(UpgradeMemoryModel *this,Instruction *ext_inst)

{
  IRContext *pIVar1;
  pointer pOVar2;
  uint32_t uVar3;
  uint32_t id;
  uint32_t uVar4;
  uint32_t uVar5;
  PodType PVar6;
  array<signed_char,_4UL> aVar7;
  Instruction *pIVar8;
  Type *pTVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  iterator instr;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  element_types;
  InstructionBuilder builder;
  Struct struct_type;
  undefined1 local_108 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_e8;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  local_d8;
  InstructionBuilder local_c0;
  Struct local_a0;
  
  uVar12 = (ext_inst->has_result_id_ & 1) + 1;
  if (ext_inst->has_type_id_ == false) {
    uVar12 = (uint)ext_inst->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(ext_inst,uVar12 + 1);
  uVar12 = (ext_inst->has_result_id_ & 1) + 1;
  if (ext_inst->has_type_id_ == false) {
    uVar12 = (uint)ext_inst->has_result_id_;
  }
  id = Instruction::GetSingleWordOperand(ext_inst,uVar12 + 3);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar8 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,id);
  uVar4 = 0;
  if (pIVar8->has_type_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar8,0);
  }
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar8 = analysis::DefUseManager::GetDef
                     ((pIVar1->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar4);
  uVar12 = (pIVar8->has_result_id_ & 1) + 1;
  if (pIVar8->has_type_id_ == false) {
    uVar12 = (uint)pIVar8->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(pIVar8,uVar12 + 1);
  uVar5 = 0;
  if (ext_inst->has_type_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(ext_inst,0);
  }
  local_d8.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_d8.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_d8.
       super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  *local_d8.
   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
   ._M_impl.super__Vector_impl_data._M_start = (Type *)0x0;
  local_d8.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = (Type *)0x0;
  pIVar1 = (this->super_Pass).context_;
  local_d8.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d8.
       super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  pTVar9 = analysis::TypeManager::GetType
                     ((pIVar1->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,uVar5);
  *local_d8.
   super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
   ._M_impl.super__Vector_impl_data._M_start = pTVar9;
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  pTVar9 = analysis::TypeManager::GetType
                     ((pIVar1->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,uVar4);
  local_d8.
  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = pTVar9;
  analysis::Struct::Struct(&local_a0,&local_d8);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  PVar6.data._M_elems =
       (array<signed_char,_4UL>)
       analysis::TypeManager::GetTypeInstruction
                 ((pIVar1->type_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl
                  ,&local_a0.super_Type);
  local_108._24_8_ = local_108 + 0x10;
  local_108._0_8_ = &PTR__SmallVector_003e9b28;
  local_e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_108._16_8_ = CONCAT44(local_108._20_4_,(uint)(uVar3 != 0x23) << 4) | 0x24;
  local_108._8_8_ = (pointer)0x1;
  pOVar2 = (ext_inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (3 < (ulong)(((long)(ext_inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
                 -0x5555555555555555)) {
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&pOVar2[3].words,(SmallVector<unsigned_int,_2UL> *)local_108);
    local_108._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_e8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_e8,local_e8._M_head_impl);
    }
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
              (&ext_inst->operands_,
               (ext_inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start + 5);
    if (ext_inst->has_type_id_ == false) {
      __assert_fail("has_type_id_",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
    }
    if (PVar6.data._M_elems == (_Type)0x0) {
      __assert_fail("ty_id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2e3,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
    }
    local_108._0_8_ = &PTR__SmallVector_003e9b28;
    local_108._24_8_ = local_108 + 0x10;
    local_e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_108._16_4_ = PVar6.data._M_elems;
    local_108._8_8_ = (pointer)0x1;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              (&((ext_inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start)->words,
               (SmallVector<unsigned_int,_2UL> *)local_108);
    local_108._0_8_ = &PTR__SmallVector_003e9b28;
    if (local_e8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_e8,local_e8._M_head_impl);
    }
    pIVar8 = (ext_inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    uVar3 = 0;
    instr.node_ = (Instruction *)0x0;
    if ((pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
      instr.node_ = pIVar8;
    }
    pIVar1 = (this->super_Pass).context_;
    local_c0.parent_ = IRContext::get_instr_block(pIVar1,instr.node_);
    local_c0.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
    local_c0.context_ = pIVar1;
    local_c0.insert_before_.super_iterator.node_ = (iterator)(iterator)instr.node_;
    if (ext_inst->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(ext_inst,(uint)ext_inst->has_type_id_);
    }
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = (pointer)0x0;
    local_108._16_4_ = (array<signed_char,_4UL>)0x0;
    local_108._20_4_ = (array<signed_char,_4UL>)0x0;
    local_108._0_8_ = operator_new(4);
    local_108._8_8_ = local_108._0_8_ + 4;
    *(undefined4 *)local_108._0_8_ = 0;
    local_108._16_8_ = local_108._8_8_;
    pIVar8 = InstructionBuilder::AddCompositeExtract
                       (&local_c0,uVar5,uVar3,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
    if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
    }
    pIVar1 = (this->super_Pass).context_;
    uVar5 = 0;
    uVar3 = 0;
    if (ext_inst->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(ext_inst,(uint)ext_inst->has_type_id_);
    }
    if (pIVar8->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
    }
    IRContext::ReplaceAllUsesWith(pIVar1,uVar3,uVar5);
    aVar7._M_elems[0] = '\0';
    aVar7._M_elems[1] = '\0';
    aVar7._M_elems[2] = '\0';
    aVar7._M_elems[3] = '\0';
    if (ext_inst->has_result_id_ == true) {
      aVar7._M_elems =
           (_Type)Instruction::GetSingleWordOperand(ext_inst,(uint)ext_inst->has_type_id_);
    }
    local_108._0_8_ = &PTR__SmallVector_003e9b28;
    local_108._24_8_ = local_108 + 0x10;
    local_e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_108._16_4_ = aVar7._M_elems;
    local_108._8_8_ = (pointer)0x1;
    uVar10 = (ulong)(pIVar8->has_result_id_ & 1) + 1;
    if (pIVar8->has_type_id_ == false) {
      uVar10 = (ulong)pIVar8->has_result_id_;
    }
    pOVar2 = (pIVar8->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = ((long)(pIVar8->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
             -0x5555555555555555;
    if (uVar10 <= uVar11 && uVar11 - uVar10 != 0) {
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar10 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_108);
      local_108._0_8_ = &PTR__SmallVector_003e9b28;
      if (local_e8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_e8,local_e8._M_head_impl);
      }
      uVar3 = 0;
      if (ext_inst->has_result_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(ext_inst,(uint)ext_inst->has_type_id_);
      }
      local_108._0_8_ = (_func_int **)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_108._16_4_ = (array<signed_char,_4UL>)0x0;
      local_108._20_4_ = (array<signed_char,_4UL>)0x0;
      local_108._0_8_ = operator_new(4);
      local_108._8_8_ = local_108._0_8_ + 4;
      *(undefined4 *)local_108._0_8_ = 1;
      local_108._16_8_ = local_108._8_8_;
      pIVar8 = InstructionBuilder::AddCompositeExtract
                         (&local_c0,uVar4,uVar3,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
      if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
      }
      uVar3 = 0;
      if (pIVar8->has_result_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
      }
      InstructionBuilder::AddStore(&local_c0,id,uVar3);
      local_a0.super_Type._vptr_Type = (_func_int **)&PTR__Struct_003ecd58;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
      ::_M_erase(&local_a0.element_decorations_._M_t,
                 (_Link_type)
                 local_a0.element_decorations_._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent);
      if (local_a0.element_types_.
          super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.element_types_.
                        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.element_types_.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.element_types_.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_a0.super_Type._vptr_Type = (_func_int **)&PTR__Type_003e9e18;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_a0.super_Type.decorations_);
      if (local_d8.
          super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d8.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.
                              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  local_108._24_8_ = local_108 + 0x10;
  local_e8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_108._8_8_ = (pointer)0x1;
  local_108._0_8_ = &PTR__SmallVector_003e9b28;
  __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                ,0x2b8,
                "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
}

Assistant:

void UpgradeMemoryModel::UpgradeExtInst(Instruction* ext_inst) {
  const bool is_modf = ext_inst->GetSingleWordInOperand(1u) == GLSLstd450Modf;
  auto ptr_id = ext_inst->GetSingleWordInOperand(3u);
  auto ptr_type_id = get_def_use_mgr()->GetDef(ptr_id)->type_id();
  auto pointee_type_id =
      get_def_use_mgr()->GetDef(ptr_type_id)->GetSingleWordInOperand(1u);
  auto element_type_id = ext_inst->type_id();
  std::vector<const analysis::Type*> element_types(2);
  element_types[0] = context()->get_type_mgr()->GetType(element_type_id);
  element_types[1] = context()->get_type_mgr()->GetType(pointee_type_id);
  analysis::Struct struct_type(element_types);
  uint32_t struct_id =
      context()->get_type_mgr()->GetTypeInstruction(&struct_type);
  // Change the operation
  GLSLstd450 new_op = is_modf ? GLSLstd450ModfStruct : GLSLstd450FrexpStruct;
  ext_inst->SetOperand(3u, {static_cast<uint32_t>(new_op)});
  // Remove the pointer argument
  ext_inst->RemoveOperand(5u);
  // Set the type id to the new struct.
  ext_inst->SetResultType(struct_id);

  // The result is now a struct of the original result. The zero'th element is
  // old result and should replace the old result. The one'th element needs to
  // be stored via a new instruction.
  auto where = ext_inst->NextNode();
  InstructionBuilder builder(
      context(), where,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  auto extract_0 =
      builder.AddCompositeExtract(element_type_id, ext_inst->result_id(), {0});
  context()->ReplaceAllUsesWith(ext_inst->result_id(), extract_0->result_id());
  // The extract's input was just changed to itself, so fix that.
  extract_0->SetInOperand(0u, {ext_inst->result_id()});
  auto extract_1 =
      builder.AddCompositeExtract(pointee_type_id, ext_inst->result_id(), {1});
  builder.AddStore(ptr_id, extract_1->result_id());
}